

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk64(envy_bios *bios)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  envy_bios_power_unk64_entry *peVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = (bios->power).unk64.offset;
  iVar9 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).unk64.version = bios->data[uVar6];
    }
    else {
      (bios->power).unk64.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).unk64.version == '\x10') {
      uVar6 = (bios->power).unk64.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).unk64.hlen = bios->data[uVar6];
        iVar9 = 0;
      }
      else {
        (bios->power).unk64.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      uVar6 = (bios->power).unk64.offset + 2;
      if (uVar6 < bios->length) {
        (bios->power).unk64.rlen = bios->data[uVar6];
        iVar7 = 0;
      }
      else {
        (bios->power).unk64.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar6 = (bios->power).unk64.offset + 3;
      if (uVar6 < bios->length) {
        (bios->power).unk64.entriesnum = bios->data[uVar6];
        iVar3 = 0;
      }
      else {
        (bios->power).unk64.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (bios->power).unk64.valid = (iVar7 == 0 && iVar9 == 0) && iVar3 == 0;
      bVar1 = (bios->power).unk64.entriesnum;
      peVar4 = (envy_bios_power_unk64_entry *)malloc((ulong)((uint)bVar1 * 4));
      (bios->power).unk64.entries = peVar4;
      if (bVar1 == 0) {
        iVar9 = 0;
      }
      else {
        uVar5 = (uint)(bios->power).unk64.hlen + (bios->power).unk64.offset;
        bVar2 = (bios->power).unk64.rlen;
        iVar9 = 0;
        uVar8 = 0;
        do {
          peVar4[uVar8].offset = uVar5;
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + bVar2;
        } while (bVar1 != uVar8);
      }
    }
    else {
      fprintf(_stderr,"Unknown FAN TEST table version 0x%x\n");
    }
  }
  return iVar9;
}

Assistant:

int envy_bios_parse_power_unk64(struct envy_bios *bios) {
	struct envy_bios_power_unk64 *unk64 = &bios->power.unk64;
	int i, err = 0;

	if (!unk64->offset)
		return -EINVAL;

	bios_u8(bios, unk64->offset + 0x0, &unk64->version);
	switch(unk64->version) {
	case 0x10:
		err |= bios_u8(bios, unk64->offset + 0x1, &unk64->hlen);
		err |= bios_u8(bios, unk64->offset + 0x2, &unk64->rlen);
		err |= bios_u8(bios, unk64->offset + 0x3, &unk64->entriesnum);
		unk64->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN TEST table version 0x%x\n", unk64->version);
		return -EINVAL;
	};

	err = 0;
	unk64->entries = malloc(unk64->entriesnum * sizeof(struct envy_bios_power_unk64_entry));
	for (i = 0; i < unk64->entriesnum; i++) {
		uint32_t data = unk64->offset + unk64->hlen + i * unk64->rlen;

		unk64->entries[i].offset = data;
	}

	return 0;
}